

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

void * dja::mat3::memcpy(void *__dest,void *__src,size_t __n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  mat3 local_38;
  
  local_38.m[2].z = *(float_t *)((long)__src + 0x20);
  local_38.m[0]._0_8_ = *__src;
  local_38.m._8_8_ = *(undefined8 *)((long)__src + 8);
  local_38.m[1]._4_8_ = *(undefined8 *)((long)__src + 0x10);
  local_38.m[2]._0_8_ = *(undefined8 *)((long)__src + 0x18);
  if ((int)__n == 0) {
    transpose(&local_38);
  }
  else {
    *(undefined4 *)((long)__dest + 0x20) = *(undefined4 *)((long)__src + 0x20);
    uVar1 = *__src;
    uVar2 = *(undefined8 *)((long)__src + 8);
    uVar3 = *(undefined8 *)((long)__src + 0x18);
    *(undefined8 *)((long)__dest + 0x10) = *(undefined8 *)((long)__src + 0x10);
    *(undefined8 *)((long)__dest + 0x18) = uVar3;
    *(undefined8 *)__dest = uVar1;
    *(undefined8 *)((long)__dest + 8) = uVar2;
  }
  return __dest;
}

Assistant:

mat3 mat3::memcpy(const float_t *v, bool rowmajor)
{
    mat3 m;
    std::memcpy(&m[0][0], v, sizeof(mat3));
    return rowmajor ? m : transpose(m);
}